

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecmath.h
# Opt level: O2

void __thiscall
pstd::array<pbrt::Point2<float>,_3>::array
          (array<pbrt::Point2<float>,_3> *this,initializer_list<pbrt::Point2<float>_> v)

{
  long lVar1;
  
  this->values[2].super_Tuple2<pbrt::Point2,_float>.x = 0.0;
  this->values[2].super_Tuple2<pbrt::Point2,_float>.y = 0.0;
  this->values[0].super_Tuple2<pbrt::Point2,_float> = (Tuple2<pbrt::Point2,_float>)0x0;
  this->values[1].super_Tuple2<pbrt::Point2,_float>.x = 0.0;
  this->values[1].super_Tuple2<pbrt::Point2,_float>.y = 0.0;
  for (lVar1 = 0; v._M_len * 8 != lVar1; lVar1 = lVar1 + 8) {
    *(undefined8 *)((long)&this->values[0].super_Tuple2<pbrt::Point2,_float>.x + lVar1) =
         *(undefined8 *)((long)&((v._M_array)->super_Tuple2<pbrt::Point2,_float>).x + lVar1);
  }
  return;
}

Assistant:

PBRT_CPU_GPU
    Point2() { x = y = 0; }